

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::RunContext::sectionEnded(RunContext *this,SectionEndInfo *endInfo)

{
  pointer *pppIVar1;
  double dVar2;
  pointer ppIVar3;
  IStreamingReporter *pIVar4;
  pointer pcVar5;
  pointer pSVar6;
  pointer pSVar7;
  bool bVar8;
  pointer this_00;
  Counts assertions;
  Counts local_a8;
  long *local_88 [2];
  long local_78 [2];
  char *local_68;
  size_t sStack_60;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  double local_40;
  undefined1 local_38;
  
  local_a8.passed = (this->m_totals).assertions.passed - (endInfo->prevAssertions).passed;
  local_a8.failed = (this->m_totals).assertions.failed - (endInfo->prevAssertions).failed;
  local_a8.failedButOk =
       (this->m_totals).assertions.failedButOk - (endInfo->prevAssertions).failedButOk;
  bVar8 = testForMissingAssertions(this,&local_a8);
  ppIVar3 = (this->m_activeSections).
            super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_activeSections).
      super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
      ._M_impl.super__Vector_impl_data._M_start != ppIVar3) {
    (*ppIVar3[-1]->_vptr_ITracker[7])();
    pppIVar1 = &(this->m_activeSections).
                super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + -1;
  }
  pIVar4 = (this->m_reporter).m_ptr;
  if (pIVar4 == (IStreamingReporter *)0x0) {
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                  ,0x4b8,
                  "T *Catch::Detail::unique_ptr<Catch::IStreamingReporter>::operator->() const [T = Catch::IStreamingReporter]"
                 );
  }
  dVar2 = endInfo->durationInSeconds;
  pcVar5 = (endInfo->sectionInfo).name._M_dataplus._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar5,pcVar5 + (endInfo->sectionInfo).name._M_string_length);
  local_68 = (endInfo->sectionInfo).lineInfo.file;
  sStack_60 = (endInfo->sectionInfo).lineInfo.line;
  local_58 = local_a8.passed;
  sStack_50 = local_a8.failed;
  local_48 = local_a8.failedButOk;
  local_40 = dVar2;
  local_38 = bVar8;
  (*pIVar4->_vptr_IStreamingReporter[0xe])(pIVar4,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pSVar6 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar7 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar6;
  if (pSVar7 != pSVar6) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar7);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar6;
  }
  return;
}

Assistant:

void RunContext::sectionEnded(SectionEndInfo const &endInfo) {
        Counts assertions = m_totals.assertions - endInfo.prevAssertions;
        bool missingAssertions = testForMissingAssertions(assertions);

        if (!m_activeSections.empty()) {
            m_activeSections.back()->close();
            m_activeSections.pop_back();
        }

        m_reporter->sectionEnded(SectionStats(endInfo.sectionInfo, assertions, endInfo.durationInSeconds, missingAssertions));
        m_messages.clear();
        m_messageScopes.clear();
    }